

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall fmt::v7::format_int::format_unsigned<unsigned_int>(format_int *this,uint value)

{
  format_decimal_result<char_*> fVar1;
  undefined8 local_28;
  uint32_or_64_or_128_t<unsigned_int> n;
  uint value_local;
  format_int *this_local;
  
  fVar1 = detail::format_decimal<char,unsigned_int>(this->buffer_,value,0x15);
  local_28 = fVar1.begin;
  return local_28;
}

Assistant:

char* format_unsigned(UInt value) {
    auto n = static_cast<detail::uint32_or_64_or_128_t<UInt>>(value);
    return detail::format_decimal(buffer_, n, buffer_size - 1).begin;
  }